

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_aco.cpp
# Opt level: O1

void aco_destroy(aco_t *co)

{
  aco_share_stack_t *paVar1;
  
  if (co != (aco_t *)0x0) {
    if (co->main_co != (aco_t *)0x0) {
      paVar1 = co->share_stack;
      if (paVar1->owner == co) {
        paVar1->owner = (aco_t *)0x0;
        paVar1->align_validsz = 0;
      }
      free((co->save_stack).ptr);
      (co->save_stack).ptr = (void *)0x0;
    }
    free(co);
    return;
  }
  abort();
}

Assistant:

void aco_destroy(aco_t* co){
    assertptr(co);
    if (!aco_is_main_co(co)) {
        if(co->share_stack->owner == co){
            co->share_stack->owner = nullptr;
            co->share_stack->align_validsz = 0;
        }
        eco_free(co->save_stack.ptr);
        co->save_stack.ptr = nullptr;
    }
    eco_free(co);
}